

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

uint __thiscall FM::OPNABase::ReadRAM(OPNABase *this)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 mask;
  uint bank;
  uint8 *p;
  uint data;
  OPNABase *this_local;
  
  if ((this->control2 & 2) == 0) {
    p._4_4_ = (uint)this->adpcmbuf[this->memaddr >> 4 & 0x3ffff];
    this->memaddr = this->memaddr + 0x10;
  }
  else {
    pbVar3 = this->adpcmbuf + (this->memaddr >> 4 & 0x7fff);
    bVar1 = (byte)(this->memaddr >> 1) & 7;
    bVar2 = (byte)(1 << bVar1);
    p._4_4_ = (((((((uint)(pbVar3[0x38000] & bVar2) * 2 + (uint)(pbVar3[0x30000] & bVar2)) * 2 +
                  (uint)(pbVar3[0x28000] & bVar2)) * 2 + (uint)(pbVar3[0x20000] & bVar2)) * 2 +
                (uint)(pbVar3[0x18000] & bVar2)) * 2 + (uint)(pbVar3[0x10000] & bVar2)) * 2 +
              (uint)(pbVar3[0x8000] & bVar2)) * 2 + (uint)(*pbVar3 & bVar2) >> bVar1;
    this->memaddr = this->memaddr + 2;
  }
  if (this->memaddr == this->stopaddr) {
    (**(this->super_OPNBase).super_Timer._vptr_Timer)(this,4);
    this->statusnext = 4;
    this->memaddr = this->memaddr & 0x3fffff;
  }
  if (this->memaddr == this->limitaddr) {
    this->memaddr = 0;
  }
  if (this->memaddr < this->stopaddr) {
    (**(this->super_OPNBase).super_Timer._vptr_Timer)(this,8);
  }
  return p._4_4_;
}

Assistant:

uint OPNABase::ReadRAM()
{
	uint data;
#ifndef NO_BITTYPE_EMULATION
	if (!(control2 & 2))
	{
		// 1 bit mode
		data = adpcmbuf[(memaddr >> 4) & 0x3ffff];
		memaddr += 16;
	}
	else
	{
		// 8 bit mode
		uint8* p = &adpcmbuf[(memaddr >> 4) & 0x7fff];
		uint bank = (memaddr >> 1) & 7;
		uint8 mask = 1 << bank;

		data =            (p[0x38000] & mask);
		data = data * 2 + (p[0x30000] & mask);
		data = data * 2 + (p[0x28000] & mask);
		data = data * 2 + (p[0x20000] & mask);
		data = data * 2 + (p[0x18000] & mask);
		data = data * 2 + (p[0x10000] & mask);
		data = data * 2 + (p[0x08000] & mask);
		data = data * 2 + (p[0x00000] & mask);
		data >>= bank;
		memaddr += 2;
	}
#else
	data = adpcmbuf[(memaddr >> granuality) & 0x3ffff];
	memaddr += 1 << granuality;
#endif
	if (memaddr == stopaddr)
	{
		SetStatus(4);
		statusnext = 0x04;	// EOS
		memaddr &= 0x3fffff;
	}
	if (memaddr == limitaddr)
	{
//		LOG1("Limit ! (%.8x)\n", limitaddr);
		memaddr = 0;
	}
	if (memaddr < stopaddr)
		SetStatus(8);
	return data;
}